

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCursor>::emplace<QCursor_const&>
          (QMovableArrayOps<QCursor> *this,qsizetype i,QCursor *args)

{
  qsizetype *pqVar1;
  QCursor **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QCursor *pQVar5;
  QCursor QVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QCursor tmp;
  Inserter local_58;
  QCursor local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002e32a4:
    local_30.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    QCursor::QCursor(&local_30,args);
    bVar7 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size != 0;
    QArrayDataPointer<QCursor>::detachAndGrow
              ((QArrayDataPointer<QCursor> *)this,(uint)(i == 0 && bVar7),1,(QCursor **)0x0,
               (QArrayDataPointer<QCursor> *)0x0);
    QVar6.d = local_30.d;
    if (i == 0 && bVar7) {
      pQVar5 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
      local_30.d = (QCursorData *)0x0;
      pQVar5[-1].d = QVar6.d;
      (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr = pQVar5 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
      local_58.displaceFrom = local_58.displaceTo + i;
      local_58.displaceTo = local_58.displaceTo + i + 1;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size - i) * 8;
      local_58.data = (QArrayDataPointer<QCursor> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      QVar6.d = local_30.d;
      local_30.d = (QCursorData *)0x0;
      (local_58.displaceFrom)->d = QVar6.d;
      local_58.displaceFrom = local_58.displaceFrom + 1;
      Inserter::~Inserter(&local_58);
    }
    QCursor::~QCursor(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QCursor::QCursor((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr
                       + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QCursor *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr))
      goto LAB_002e32a4;
      QCursor::QCursor((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr
                       + -1,args);
      ppQVar2 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }